

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O2

void Omega_h::partition_by_elems(Mesh *mesh,bool verbose)

{
  Int ent_dim;
  LO nrroots;
  LOs owned2all;
  Read<signed_char> marked_owned;
  Remotes owned2owners;
  Remotes all2owners;
  Dist dist;
  undefined1 auStack_208 [48];
  Write<int> local_1d8;
  undefined1 local_1c8 [48];
  Remotes local_198;
  Remotes local_178;
  Remotes local_158;
  Dist local_138;
  Dist local_a8;
  
  ent_dim = Mesh::dim(mesh);
  Mesh::ask_owners(&local_158,mesh,ent_dim);
  Mesh::owned((Mesh *)local_1c8,(Int)mesh);
  Write<signed_char>::Write
            ((Write<signed_char> *)(auStack_208 + 0x20),(Write<signed_char> *)local_1c8);
  collect_marked((Omega_h *)&local_1d8,(Read<signed_char> *)(auStack_208 + 0x20));
  Write<signed_char>::~Write((Write<signed_char> *)(auStack_208 + 0x20));
  Write<int>::Write((Write<int> *)(auStack_208 + 0x10),&local_1d8);
  Remotes::Remotes(&local_198,&local_158);
  unmap(&local_178,(LOs *)(auStack_208 + 0x10),&local_198);
  Remotes::~Remotes(&local_198);
  Write<int>::~Write((Write<int> *)(auStack_208 + 0x10));
  Mesh::comm((Mesh *)auStack_208);
  Remotes::Remotes((Remotes *)(local_1c8 + 0x10),&local_178);
  nrroots = Mesh::nelems(mesh);
  Dist::Dist(&local_a8,(CommPtr *)auStack_208,(Remotes *)(local_1c8 + 0x10),nrroots);
  Remotes::~Remotes((Remotes *)(local_1c8 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_208 + 8));
  Dist::Dist(&local_138,&local_a8);
  migrate_mesh(mesh,&local_138,OMEGA_H_ELEM_BASED,verbose);
  Dist::~Dist(&local_138);
  Dist::~Dist(&local_a8);
  Remotes::~Remotes(&local_178);
  Write<int>::~Write(&local_1d8);
  Write<signed_char>::~Write((Write<signed_char> *)local_1c8);
  Remotes::~Remotes(&local_158);
  return;
}

Assistant:

void partition_by_elems(Mesh* mesh, bool verbose) {
  auto dim = mesh->dim();
  auto all2owners = mesh->ask_owners(dim);
  auto marked_owned = mesh->owned(dim);
  auto owned2all = collect_marked(marked_owned);
  auto owned2owners = unmap(owned2all, all2owners);
  auto dist = Dist(mesh->comm(), owned2owners, mesh->nelems());
  migrate_mesh(mesh, dist, OMEGA_H_ELEM_BASED, verbose);
}